

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O2

void LDSketch_destroy(LDSketch_t *sk)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < (long)sk->w * (long)sk->h; lVar1 = lVar1 + 1) {
    dyn_tbl_destroy(sk->tbl[lVar1]);
  }
  free(sk->tbl);
  free(sk);
  return;
}

Assistant:

void LDSketch_destroy(LDSketch_t* sk) {
	// free(LDSketch->T);
	for (int i = 0; i < sk->h * sk->w; ++i) {
		dyn_tbl_destroy(sk->tbl[i]);
	}
	free(sk->tbl);
	free(sk);
}